

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeList.c
# Opt level: O2

unsigned_long ixmlNodeList_length(IXML_NodeList *nList)

{
  unsigned_long length;
  
  length = 0;
  for (; nList != (IXML_NodeList *)0x0; nList = nList->next) {
    length = length + 1;
  }
  return length;
}

Assistant:

unsigned long ixmlNodeList_length(IXML_NodeList *nList)
{
	IXML_NodeList *list;
	unsigned long length = 0lu;

	list = nList;
	while (list != NULL) {
		++length;
		list = list->next;
	}

	return length;
}